

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
               (ostream *out,char *fmt,ChainstateRole *args,unsigned_long *args_1,
               unsigned_long *args_2,long *args_3,int *args_4,int *args_5,int *args_6)

{
  long lVar1;
  ChainstateRole *in_RCX;
  int *in_RSI;
  ostream *in_RDI;
  unsigned_long *in_R8;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  FormatListRef in_stack_00000010;
  char *in_stack_00000018;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
            (in_RCX,in_R8,in_R9,(long *)&stack0xffffffffffffff40,in_RSI,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff48);
  vformat(in_RDI,in_stack_00000018,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}